

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

void run_test(testing t)

{
  testing_base_s *ptVar1;
  uint uVar2;
  char *__ptr;
  nsync_time nVar3;
  char *local_90;
  char *local_80;
  __time_t local_30;
  __syscall_slong_t local_28;
  char *elapsed_str;
  testing_base tb;
  testing t_local;
  
  ptVar1 = t->base;
  fprintf((FILE *)t->fp,"%-25s %-45s  ",ptVar1->prog,t->name);
  fflush((FILE *)t->fp);
  std::atomic_store_explicit<unsigned_int>(&t->partial_line,1,memory_order_relaxed);
  t->test_status = 0;
  t->n = 0;
  (t->stop_time).tv_sec = 0;
  (t->stop_time).tv_nsec = 0;
  nVar3 = nsync::nsync_time_now();
  local_30 = nVar3.tv_sec;
  (t->start_time).tv_sec = local_30;
  local_28 = nVar3.tv_nsec;
  (t->start_time).tv_nsec = local_28;
  (*t->f)(t);
  nVar3 = nsync::nsync_time_now();
  nVar3 = nsync::nsync_time_sub(nVar3,t->start_time);
  __ptr = nsync_time_str(nVar3,2);
  uVar2 = std::atomic_load_explicit<unsigned_int>(&t->partial_line,memory_order_relaxed);
  if (uVar2 == 0) {
    if (t->test_status == 0) {
      local_80 = "passed";
    }
    else {
      local_80 = "failed";
    }
    fprintf((FILE *)t->fp,"%-25s %-45s  %s %8s\n",ptVar1->prog,t->name,local_80,__ptr);
  }
  else {
    if (t->test_status == 0) {
      local_90 = "passed";
    }
    else {
      local_90 = "failed";
    }
    fprintf((FILE *)t->fp,"%s %8s\n",local_90,__ptr);
  }
  std::atomic_store_explicit<unsigned_int>(&t->partial_line,0,memory_order_relaxed);
  fflush((FILE *)t->fp);
  free(__ptr);
  finish_run(t);
  return;
}

Assistant:

static void run_test (testing t) {
	testing_base tb = t->base;
	char *elapsed_str = 0;
	fprintf (t->fp, "%-25s %-45s  ", tb->prog, t->name);
	fflush (t->fp);
	ATM_STORE (&t->partial_line, 1);
	t->test_status = 0;
	t->n = 0;
	t->stop_time = nsync_time_zero;
	t->start_time = nsync_time_now ();
	(*t->f) (t);
	elapsed_str = nsync_time_str (nsync_time_sub (nsync_time_now (), t->start_time), 2);
	if (!ATM_LOAD (&t->partial_line)) {
		fprintf (t->fp, "%-25s %-45s  %s %8s\n", tb->prog, t->name,
		         t->test_status != 0? "failed": "passed", elapsed_str);
	} else {
		fprintf (t->fp, "%s %8s\n", t->test_status != 0? "failed": "passed", elapsed_str);
	}
	ATM_STORE (&t->partial_line, 0);
	fflush (t->fp);
	free (elapsed_str);
	finish_run (t);
}